

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O0

bool pstore::repo::fragment::fragment_appears_valid
               (fragment *f,extent<pstore::repo::fragment> *fext)

{
  bool bVar1;
  section_kind sVar2;
  section_kind sVar3;
  reference pvVar4;
  value_type *pvVar5;
  ulong local_a0;
  undefined1 local_90 [7];
  section_kind kind;
  ulong local_78;
  unsigned_long next_offset;
  value_type this_offset;
  undefined1 local_60 [7];
  section_kind index;
  iterator index_end;
  iterator index_it;
  uint64_t offset;
  extent<pstore::repo::fragment> *peStack_20;
  indices indices;
  extent<pstore::repo::fragment> *fext_local;
  fragment *f_local;
  
  peStack_20 = fext;
  bVar1 = std::operator!=(&f->signature_,&fragment_signature_);
  if (bVar1) {
    f_local._7_1_ = false;
  }
  else {
    offset._4_4_ = (uint)section_sparray<unsigned_long>::get_indices(&f->arr_);
    bVar1 = section_sparray<unsigned_long>::indices::empty((indices *)((long)&offset + 4));
    if ((bVar1) ||
       (sVar2 = section_sparray<unsigned_long>::indices::back((indices *)((long)&offset + 4)),
       linked_definitions < sVar2)) {
      f_local._7_1_ = false;
    }
    else {
      index_it.value_ = 0x20;
      index_it._17_7_ = 0;
      std::begin<pstore::repo::section_sparray<unsigned_long>::indices>
                ((iterator *)&index_end.value_,(indices *)((long)&offset + 4));
      std::end<pstore::repo::section_sparray<unsigned_long>::indices>
                ((iterator *)local_60,(indices *)((long)&offset + 4));
      while (bVar1 = details::
                     cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                     ::operator!=((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                                   *)&index_end.value_,
                                  (cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                                   *)local_60), bVar1) {
        pvVar4 = details::
                 cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                 ::operator*((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                              *)&index_end.value_);
        this_offset._7_1_ = *pvVar4;
        pvVar5 = section_sparray<unsigned_long>::operator[](&f->arr_,this_offset._7_1_);
        sVar2 = this_offset._7_1_;
        next_offset = *pvVar5;
        sVar3 = section_sparray<unsigned_long>::indices::back((indices *)((long)&offset + 4));
        if (sVar2 == sVar3) {
          local_a0 = peStack_20->size;
        }
        else {
          details::
          cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
          ::operator+((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                       *)local_90,
                      (cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                       *)&index_end.value_,1);
          pvVar4 = details::
                   cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                   ::operator*((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                                *)local_90);
          pvVar5 = section_sparray<unsigned_long>::operator[](&f->arr_,*pvVar4);
          local_a0 = *pvVar5;
        }
        sVar2 = this_offset._7_1_;
        local_78 = local_a0;
        if ((next_offset < (ulong)index_it._16_8_) || (local_a0 <= next_offset)) {
          return false;
        }
        bVar1 = has_section(f,this_offset._7_1_);
        if (!bVar1) {
          assert_failed("f.has_section (kind)",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                        ,0x96);
        }
        switch(sVar2) {
        case text:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)0,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case data:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)1,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case bss:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)2,pstore::repo::bss_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case rel_ro:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)3,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_1_byte_c_string:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)4,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_2_byte_c_string:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)5,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_4_byte_c_string:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)6,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_const_4:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)7,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_const_8:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)8,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_const_16:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)9,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case mergeable_const_32:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)10,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case read_only:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)11,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case thread_data:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)12,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case thread_bss:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)13,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case debug_line:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)14,pstore::repo::debug_line_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case debug_loc:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)15,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case debug_string:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)16,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case debug_ranges:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)17,pstore::repo::generic_section>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case linked_definitions:
          index_it._16_8_ =
               section_offset_is_valid<(pstore::repo::section_kind)18,pstore::repo::linked_definitions>
                         (f,peStack_20,index_it._16_8_,next_offset,local_78 - next_offset);
          break;
        case last:
          assert_failed("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                        ,0x9f);
        }
        if (index_it._16_8_ == 0) {
          return false;
        }
        details::
        cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
        ::operator++((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                      *)&index_end.value_);
      }
      f_local._7_1_ = true;
    }
  }
  return f_local._7_1_;
}

Assistant:

bool fragment::fragment_appears_valid (fragment const & f, pstore::extent<fragment> const & fext) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (f.signature_ != fragment_signature_) {
        return false;
    }
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED

    auto const indices = f.arr_.get_indices ();
    if (indices.empty () || indices.back () >= section_kind::last) {
        return false;
    }

    std::uint64_t offset = sizeof (fragment);
    for (auto index_it = std::begin (indices), index_end = std::end (indices);
         index_it != index_end; ++index_it) {
        section_kind const index = *index_it;

        auto const this_offset = f.arr_[index];
        auto const next_offset = (index == indices.back ()) ? fext.size : f.arr_[*(index_it + 1)];
        if (this_offset < offset || next_offset <= this_offset) {
            return false;
        }

        section_kind const kind = static_cast<section_kind> (index);
        PSTORE_ASSERT (f.has_section (kind));
#define X(k)                                                                                       \
    case section_kind::k:                                                                          \
        offset = fragment::section_offset_is_valid<section_kind::k> (f, fext, offset, this_offset, \
                                                                     next_offset - this_offset);   \
        break;

        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case repo::section_kind::last: PSTORE_ASSERT (false); break;
        }
#undef X
        if (offset == 0) {
            return false;
        }
    }

    return true;
}